

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O1

void __thiscall duel::createDeck(duel *this,card *cards)

{
  ulong uVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  vector<card,_std::allocator<card>_> temp;
  vector<card,_std::allocator<card>_> local_48;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_30;
  
  std::vector<card,_std::allocator<card>_>::vector
            (&local_48,(ulong)this->totalCards,(allocator_type *)&local_30);
  if (this->totalCards != 0) {
    uVar4 = 0;
    lVar3 = 0x10;
    uVar1 = 0;
    do {
      uVar1 = (ulong)((uint)((uVar4 & 3) == 0 && uVar4 != 0) + (int)uVar1);
      *(uint *)((long)local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar3 + -8) = cards[uVar1].value;
      *(undefined8 *)
       ((long)local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
              super__Vector_impl_data._M_start + lVar3 + -0x10) = *(undefined8 *)(cards + uVar1);
      std::__cxx11::string::_M_assign
                ((string *)
                 (&(local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
                    super__Vector_impl_data._M_start)->bolted + lVar3));
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 < this->totalCards);
  }
  uVar1 = std::chrono::_V2::system_clock::now();
  local_30._M_x = uVar1 % 0x7fffffff + (ulong)(uVar1 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>)
             local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>)
             local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_30);
  if (this->totalCards != 0) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      uVar4 = ((long)local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if (uVar4 < uVar1 || uVar4 - uVar1 == 0) {
        uVar2 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar1);
        std::vector<card,_std::allocator<card>_>::~vector(&local_48);
        _Unwind_Resume(uVar2);
      }
      std::deque<card,_std::allocator<card>_>::push_back
                (&(this->deck).c,
                 (value_type *)
                 (&(local_48.super__Vector_base<card,_std::allocator<card>_>._M_impl.
                    super__Vector_impl_data._M_start)->bolted + lVar3));
      uVar1 = uVar1 + 1;
      lVar3 = lVar3 + 0x30;
    } while ((uint)uVar1 < this->totalCards);
  }
  std::vector<card,_std::allocator<card>_>::~vector(&local_48);
  return;
}

Assistant:

void duel::createDeck(const card cards[]) {
    vector<card> temp(totalCards);
    int type = 0;
    // put in a filled deck in a temp vector
    for(unsigned int i = 0; i < totalCards; i++) {
        if ((i != 0) && (i % CARD_QUANTITY_MAX == 0)) ++type;
        temp[i] = cards[type];
    }
    // randomize that vector
    long seed = static_cast<long>(chrono::system_clock::now().time_since_epoch().count());
    shuffle(temp.begin(),temp.end(),default_random_engine(seed));
    // push the randomized vector to the deck
    for(unsigned int i = 0; i < totalCards; i++) {
        deck.push(temp.at(i));
    }
}